

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pg_functions.cpp
# Opt level: O1

void * duckdb_libpgquery::palloc(size_t n)

{
  size_t *psVar1;
  long lVar2;
  ulong n_00;
  size_t *__s;
  long *in_FS_OFFSET;
  
  n_00 = n + 0xf & 0xfffffffffffffff8;
  lVar2 = *in_FS_OFFSET;
  if (0x2800 < *(long *)(lVar2 + -0x30) + n_00) {
    allocate_new((parser_state *)(lVar2 + -0x2038),n_00);
  }
  psVar1 = (size_t *)
           (*(long *)(*(long *)(lVar2 + -0x20) + -8 + *(long *)(lVar2 + -0x28) * 8) +
           *(long *)(lVar2 + -0x30));
  __s = psVar1 + 1;
  *psVar1 = n;
  switchD_005700f1::default(__s,0,n);
  *(long *)(lVar2 + -0x30) = *(long *)(lVar2 + -0x30) + n_00;
  return __s;
}

Assistant:

void *palloc(size_t n) {
	// we need to align our pointers for the sanitizer
	auto allocate_n = n + sizeof(size_t);
	auto aligned_n = ((allocate_n + 7) / 8) * 8;
	if (pg_parser_state.malloc_pos + aligned_n > PG_MALLOC_SIZE) {
		allocate_new(&pg_parser_state, aligned_n);
	}

	// store the length of the allocation
	char *base_ptr = pg_parser_state.malloc_ptrs[pg_parser_state.malloc_ptr_idx - 1] + pg_parser_state.malloc_pos;
	memcpy(base_ptr, &n, sizeof(size_t));
	// store the actual pointer
	char *ptr = (char*) base_ptr + sizeof(size_t);
	memset(ptr, 0, n);
	pg_parser_state.malloc_pos += aligned_n;
	return ptr;
}